

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_mgr.cxx
# Opt level: O1

void __thiscall
nuraft::nuraft_global_mgr::append_worker_loop(nuraft_global_mgr *this,ptr<worker_handle> *handle)

{
  mutex *__mutex;
  list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
  *this_00;
  ulong __val;
  _List_node_base *p_Var1;
  element_type *peVar2;
  raft_server *prVar3;
  nuraft_global_mgr *pnVar4;
  char cVar5;
  int iVar6;
  long *plVar7;
  pthread_t __target_thread;
  ulong uVar8;
  long *plVar9;
  char cVar10;
  size_t sVar11;
  bool bVar12;
  ptr<raft_server> target;
  string __str;
  string thread_name;
  raft_server *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_90 [2];
  nuraft_global_mgr *local_80;
  string local_78;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  _Hashtable<std::shared_ptr<nuraft::raft_server>,_std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<nuraft::raft_server>_>,_std::hash<std::shared_ptr<nuraft::raft_server>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_38;
  
  __val = ((handle->
           super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>)
          ._M_ptr)->id_;
  cVar10 = '\x01';
  if (9 < __val) {
    uVar8 = __val;
    cVar5 = '\x04';
    do {
      cVar10 = cVar5;
      if (uVar8 < 100) {
        cVar10 = cVar10 + -2;
        goto LAB_0015ad80;
      }
      if (uVar8 < 1000) {
        cVar10 = cVar10 + -1;
        goto LAB_0015ad80;
      }
      if (uVar8 < 10000) goto LAB_0015ad80;
      bVar12 = 99999 < uVar8;
      uVar8 = uVar8 / 10000;
      cVar5 = cVar10 + '\x04';
    } while (bVar12);
    cVar10 = cVar10 + '\x01';
  }
LAB_0015ad80:
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_80 = this;
  std::__cxx11::string::_M_construct((ulong)&local_78,cVar10);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_78._M_dataplus._M_p,(uint)local_78._M_string_length,__val);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x167e66);
  local_58 = &local_48;
  plVar9 = plVar7 + 2;
  if ((long *)*plVar7 == plVar9) {
    local_48 = *plVar9;
    lStack_40 = plVar7[3];
  }
  else {
    local_48 = *plVar9;
    local_58 = (long *)*plVar7;
  }
  local_50 = plVar7[1];
  *plVar7 = (long)plVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  __target_thread = pthread_self();
  pthread_setname_np(__target_thread,(char *)local_58);
  if (((((handle->
         super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>).
        _M_ptr)->stopping_)._M_base._M_i & 1U) == 0) {
    __mutex = &local_80->append_queue_lock_;
    this_00 = &local_80->append_queue_;
    local_38 = &(local_80->append_server_set_)._M_h;
    do {
      LOCK();
      (((handle->
        super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr)->status_)._M_i = SLEEPING;
      UNLOCK();
      EventAwaiter::wait_us
                (&((handle->
                   super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr)->ea_,1000000);
      LOCK();
      (((handle->
        super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr)->ea_).status._M_i = idle;
      UNLOCK();
      LOCK();
      (((handle->
        super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr)->status_)._M_i = WORKING;
      UNLOCK();
      do {
        if (((((handle->
               super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr)->stopping_)._M_base._M_i & 1U) != 0) goto LAB_0015ae39;
        local_98 = (raft_server *)0x0;
        a_Stack_90[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        iVar6 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
        if (iVar6 != 0) {
          std::__throw_system_error(iVar6);
        }
        p_Var1 = (this_00->
                 super__List_base<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
                 )._M_impl._M_node.super__List_node_base._M_next;
        if (p_Var1 == (_List_node_base *)this_00) {
          bVar12 = false;
          sVar11 = 0;
        }
        else {
          local_98 = (raft_server *)p_Var1[1]._M_next;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (a_Stack_90,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var1[1]._M_prev);
          std::
          _Hashtable<std::shared_ptr<nuraft::raft_server>,_std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<nuraft::raft_server>_>,_std::hash<std::shared_ptr<nuraft::raft_server>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::_M_erase(local_38,&local_98);
          pnVar4 = local_80;
          std::__cxx11::
          list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
          ::_M_erase(this_00,(local_80->append_queue_).
                             super__List_base<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
                             ._M_impl._M_node.super__List_node_base._M_next);
          sVar11 = (pnVar4->append_queue_).
                   super__List_base<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
                   ._M_impl._M_node._M_size;
          bVar12 = (pnVar4->append_queue_).
                   super__List_base<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
                   ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)this_00;
        }
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        prVar3 = local_98;
        if (local_98 != (raft_server *)0x0) {
          peVar2 = (local_98->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          if ((peVar2 != (element_type *)0x0) && (iVar6 = (*peVar2->_vptr_logger[7])(), 5 < iVar6))
          {
            peVar2 = (prVar3->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            msg_if_given_abi_cxx11_
                      (&local_78,"executed append_entries by global worker, queue length %zu",sVar11
                      );
            (*peVar2->_vptr_logger[8])
                      (peVar2,6,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/global_mgr.cxx"
                       ,"append_worker_loop",0x187,&local_78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p);
            }
          }
          bVar12 = true;
          raft_server::append_entries_in_bg_exec(local_98);
        }
        if (a_Stack_90[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_90[0]._M_pi);
        }
        if (((((handle->
               super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr)->stopping_)._M_base._M_i & 1U) != 0) goto LAB_0015ae39;
      } while (bVar12);
    } while( true );
  }
LAB_0015ae39:
  if (local_58 != &local_48) {
    operator_delete(local_58);
  }
  return;
}

Assistant:

void nuraft_global_mgr::append_worker_loop(ptr<worker_handle> handle) {
    std::string thread_name = "nuraft_g_a" + std::to_string(handle->id_);
#ifdef __linux__
    pthread_setname_np(pthread_self(), thread_name.c_str());
#elif __APPLE__
    pthread_setname_np(thread_name.c_str());
#endif

    bool skip_sleeping = false;
    while (!handle->stopping_) {
        if (!skip_sleeping) {
            handle->status_ = worker_handle::SLEEPING;
            // Ditto, just in case.
            handle->ea_.wait_ms(1000);
            handle->ea_.reset();
            handle->status_ = worker_handle::WORKING;
        }
        if (handle->stopping_) break;

        skip_sleeping = false;
        size_t queue_length = 0;
        ptr<raft_server> target = nullptr;
        {
            std::lock_guard<std::mutex> l(append_queue_lock_);
            auto entry = append_queue_.begin();
            if (entry != append_queue_.end()) {
                target = *entry;
                append_server_set_.erase(target);
                append_queue_.pop_front();
                queue_length = append_queue_.size();
                if (!append_queue_.empty()) {
                    // Other requests are waiting in the queue,
                    // skip sleeping next time.
                    skip_sleeping = true;
                }
            }
        }
        if (!target) continue;

        ptr<logger>& l_ = target->l_;

        // Whenever we find a task to execute, skip next sleeping for any tasks
        // that can be queued in the meantime.
        skip_sleeping = true;

        p_tr("executed append_entries by global worker, queue length %zu",
             queue_length);
        target->append_entries_in_bg_exec();
    }
}